

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O1

sync_edges_t * __thiscall
tchecker::syncprod::vloc_edges_iterator_t::operator*
          (sync_edges_t *__return_storage_ptr__,vloc_edges_iterator_t *this)

{
  begin_iterator_t *this_00;
  synchronization_t *psVar1;
  synchronization_t *psVar2;
  uint *puVar3;
  edges_iterator_t begin;
  edges_iterator_t end;
  edges_iterator_t local_78;
  edges_iterator_t local_58;
  edge_const_shared_ptr_t local_30;
  
  psVar1 = (this->_sync_it)._sync_it._M_current;
  psVar2 = (this->_sync_it)._sync_end._M_current;
  puVar3 = (this->_async_it)._it.super_type.m_iterator;
  if ((psVar1 == psVar2) && (puVar3 == (this->_async_it)._end.super_type.m_iterator)) {
    __assert_fail("!at_end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/edges_iterators.cc"
                  ,0xdc,
                  "vloc_edges_iterator_t::sync_edges_t tchecker::syncprod::vloc_edges_iterator_t::operator*()"
                 );
  }
  if (psVar1 != psVar2) {
    local_78._sync_it._it._M_current =
         (iterator)
         (this->_sync_it)._cartesian_it._its.
         super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._sync_it._it._M_current =
         (iterator)
         (this->_sync_it)._cartesian_it._its.
         super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_78._async_at_end = false;
    local_78._async_edge.
    super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78._async_edge.
    super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._async_at_end = false;
    local_58._async_edge.
    super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58._async_edge.
    super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->sync_id = psVar1->_id;
LAB_001ac271:
    range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::range_t
              (&__return_storage_ptr__->edges,&local_78,&local_58);
    if (local_58._async_edge.
        super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58._async_edge.
                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78._async_edge.
        super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78._async_edge.
                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return __return_storage_ptr__;
  }
  if ((puVar3 != (this->_async_it)._end.super_type.m_iterator) &&
     ((this->_async_it)._range_it.super_const_iterator._M_current !=
      (this->_async_it)._range_end.super_const_iterator._M_current)) {
    this_00 = &(this->_async_it)._range_it;
    system_t::asynchronous_edges_const_iterator_t::operator*(this_00);
    edges_iterator_t::edges_iterator_t(&local_78,&local_58._async_edge,false);
    if (local_58._async_edge.
        super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58._async_edge.
                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((this->_async_it)._it.super_type.m_iterator != (this->_async_it)._end.super_type.m_iterator
        ) && ((this->_async_it)._range_it.super_const_iterator._M_current !=
              (this->_async_it)._range_end.super_const_iterator._M_current)) {
      system_t::asynchronous_edges_const_iterator_t::operator*(this_00);
      edges_iterator_t::edges_iterator_t(&local_58,&local_30,true);
      if (local_30.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.
                   super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __return_storage_ptr__->sync_id = 0xffffffff;
      goto LAB_001ac271;
    }
  }
  __assert_fail("(_it != _end) && (_range_it != _range_end)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                ,0x158,
                "decltype(auto) tchecker::join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t> (unsigned int)>, const unsigned int *>>, tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>>::operator*() const [R = tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t> (unsigned int)>, const unsigned int *>>, SUBR = tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>]"
               );
}

Assistant:

vloc_edges_iterator_t::sync_edges_t vloc_edges_iterator_t::operator*()
{
  assert(!at_end());

  if (_sync_it != tchecker::past_the_end_iterator) {
    tchecker::syncprod::vloc_synchronized_edges_iterator_t::sync_edges_t sync_edges = *_sync_it;
    tchecker::syncprod::edges_iterator_t begin(sync_edges.edges.begin()), end(sync_edges.edges.end());
    return tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t{.sync_id = sync_edges.sync_id,
                                                                   .edges = tchecker::make_range(begin, end)};
  }

  tchecker::syncprod::edges_iterator_t begin(*_async_it, false), end(*_async_it, true);
  return tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t{.sync_id = tchecker::NO_SYNC,
                                                                 .edges = tchecker::make_range(begin, end)};
}